

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hash.h
# Opt level: O2

void __thiscall
tsl::detail_robin_hash::
robin_hash<std::pair<unsigned_long,_ImputedData<long,_double>_>,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
::robin_hash(robin_hash<std::pair<unsigned_long,_ImputedData<long,_double>_>,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
             *this,size_type bucket_count,hash<unsigned_long> *hash,equal_to<unsigned_long> *equal,
            allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_> *alloc,
            float min_load_factor,float max_load_factor)

{
  bucket_entry *pbVar1;
  length_error *this_00;
  float fVar2;
  allocator_type local_29;
  float local_28;
  float local_24;
  size_type bucket_count_local;
  
  local_28 = min_load_factor;
  local_24 = max_load_factor;
  bucket_count_local = bucket_count;
  rh::power_of_two_growth_policy<2UL>::power_of_two_growth_policy
            (&this->super_power_of_two_growth_policy<2UL>,&bucket_count_local);
  std::
  vector<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_ImputedData<long,_double>_>,_false>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_ImputedData<long,_double>_>,_false>_>_>
  ::vector(&this->m_buckets_data,bucket_count_local,&local_29);
  pbVar1 = (this->m_buckets_data).
           super__Vector_base<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_ImputedData<long,_double>_>,_false>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_ImputedData<long,_double>_>,_false>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pbVar1 == (this->m_buckets_data).
                super__Vector_base<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_ImputedData<long,_double>_>,_false>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_ImputedData<long,_double>_>,_false>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar1 = static_empty_bucket_ptr(this);
  }
  this->m_buckets = pbVar1;
  this->m_bucket_count = bucket_count_local;
  this->m_nb_elements = 0;
  this->m_grow_on_next_insert = false;
  this->m_try_shrink_on_next_insert = false;
  if (bucket_count_local >> 0x37 == 0) {
    if (bucket_count_local != 0) {
      (this->m_buckets_data).
      super__Vector_base<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_ImputedData<long,_double>_>,_false>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_ImputedData<long,_double>_>,_false>_>_>
      ._M_impl.super__Vector_impl_data._M_finish[-1].m_last_bucket = true;
    }
    fVar2 = local_28;
    if (local_28 <= 0.0) {
      fVar2 = 0.0;
    }
    if (0.15 <= fVar2) {
      fVar2 = 0.15;
    }
    this->m_min_load_factor = fVar2;
    robin_hash<std::pair<unsigned_long,_ImputedData<long,_double>_>,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
    ::max_load_factor(this,local_24);
    return;
  }
  this_00 = (length_error *)__cxa_allocate_exception(0x10);
  std::length_error::length_error(this_00,"The map exceeds its maximum bucket count.");
  __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
}

Assistant:

robin_hash(size_type bucket_count, const Hash& hash, const KeyEqual& equal,
             const Allocator& alloc,
             float min_load_factor = DEFAULT_MIN_LOAD_FACTOR,
             float max_load_factor = DEFAULT_MAX_LOAD_FACTOR)
      : Hash(hash),
        KeyEqual(equal),
        GrowthPolicy(bucket_count),
        m_buckets_data(bucket_count, alloc),
        m_buckets(m_buckets_data.empty() ? static_empty_bucket_ptr()
                                         : m_buckets_data.data()),
        m_bucket_count(bucket_count),
        m_nb_elements(0),
        m_grow_on_next_insert(false),
        m_try_shrink_on_next_insert(false) {
    if (bucket_count > max_bucket_count()) {
      TSL_RH_THROW_OR_TERMINATE(std::length_error,
                                "The map exceeds its maximum bucket count.");
    }

    if (m_bucket_count > 0) {
      tsl_rh_assert(!m_buckets_data.empty());
      m_buckets_data.back().set_as_last_bucket();
    }

    this->min_load_factor(min_load_factor);
    this->max_load_factor(max_load_factor);
  }